

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O0

int __thiscall
datadog::Dogstatsd::count
          (Dogstatsd *this,string *name,int64_t value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,double rate)

{
  ostream *poVar1;
  ssize_t sVar2;
  int in_R8D;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  string local_1f8 [32];
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream statd;
  double rate_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags_local;
  int64_t value_local;
  string *name_local;
  Dogstatsd *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,value);
  std::operator<<(poVar1,"|c");
  std::__cxx11::string::string(local_1d8,(string *)name);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,tags);
  sVar2 = send(this,(int)local_1d8,local_1f8,(size_t)&local_210,in_R8D);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return (int)sVar2;
}

Assistant:

int Dogstatsd::count( std::string name, int64_t value, std::vector<std::string> tags, double rate){
    std::ostringstream statd;
    statd << value << "|c";
    return send(name, statd.str(), tags, rate);
  }